

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::base_internal::anon_unknown_0::ArenaLock::ArenaLock
          (ArenaLock *this,Arena *arena)

{
  int iVar1;
  undefined1 local_98 [8];
  sigset_t all;
  Arena *arena_local;
  ArenaLock *this_local;
  
  this->left_ = false;
  this->mask_valid_ = false;
  this->arena_ = arena;
  all.__val[0xf] = (unsigned_long)arena;
  if ((arena->flags & 2) != 0) {
    sigfillset((sigset_t *)local_98);
    iVar1 = pthread_sigmask(0,(__sigset_t *)local_98,(__sigset_t *)&this->mask_);
    this->mask_valid_ = iVar1 == 0;
  }
  SpinLock::Lock(&this->arena_->mu);
  return;
}

Assistant:

arena_(arena) {
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
    if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
      sigset_t all;
      sigfillset(&all);
      mask_valid_ = pthread_sigmask(SIG_BLOCK, &all, &mask_) == 0;
    }
#endif
    arena_->mu.Lock();
  }